

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

bool __thiscall
cmGraphVizWriter::GenerateForTargetType(cmGraphVizWriter *this,TargetType targetType)

{
  switch(targetType) {
  case EXECUTABLE:
    return this->GenerateForExecutables;
  case STATIC_LIBRARY:
    return this->GenerateForStaticLibs;
  case SHARED_LIBRARY:
    return this->GenerateForSharedLibs;
  case MODULE_LIBRARY:
    return this->GenerateForModuleLibs;
  default:
    return false;
  }
}

Assistant:

bool cmGraphVizWriter::GenerateForTargetType(cmTarget::TargetType targetType)
                                                                          const
{
  switch (targetType)
  {
    case cmTarget::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmTarget::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmTarget::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmTarget::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    default:
      break;
  }
  return false;
}